

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O3

Maybe<kj::Array<capnp::PipelineOp>_> * capnp::_::anon_unknown_0::toPipelineOps(Reader ops)

{
  ushort uVar1;
  ListElementCount LVar2;
  void *firstElement;
  ulong uVar3;
  void *pvVar4;
  Maybe<kj::Array<capnp::PipelineOp>_> *pMVar5;
  Maybe<kj::Array<capnp::PipelineOp>_> *extraout_RAX;
  Maybe<kj::Array<capnp::PipelineOp>_> *extraout_RAX_00;
  ulong capacity;
  ElementCount index;
  undefined1 *in_RDI;
  undefined1 *puVar6;
  long lVar7;
  PipelineOp *ptrCopy;
  long lVar8;
  Fault f;
  uint local_84;
  void *local_80;
  void *local_78;
  void *local_70;
  undefined8 *local_68;
  Reader opReader;
  
  LVar2 = ops.reader.elementCount;
  capacity = (ulong)ops.reader.elementCount;
  index = 0;
  lVar8 = 8;
  firstElement = kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_70 = (void *)((long)firstElement + capacity * 8);
  local_68 = &kj::_::HeapArrayDisposer::instance;
  pvVar4 = firstElement;
  if (capacity != 0) {
    lVar7 = 0;
    puVar6 = in_RDI;
    local_80 = firstElement;
    local_78 = firstElement;
    do {
      ListReader::getStructElement(&opReader._reader,&ops.reader,index);
      if (opReader._reader.dataSize < 0x10) {
        uVar3 = 0;
      }
      else {
        uVar1 = *opReader._reader.data;
        uVar3 = (ulong)uVar1;
        if (uVar1 != 0) {
          local_84 = (uint)uVar1;
          if (local_84 != 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],unsigned_int>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x53,FAILED,(char *)0x0,
                       "\"Unsupported pipeline op.\", (uint)opReader.which()",
                       (char (*) [25])"Unsupported pipeline op.",&local_84);
            *in_RDI = 0;
            kj::_::Debug::Fault::~Fault(&f);
            if (firstElement == (void *)0x0) {
              return extraout_RAX;
            }
            kj::_::HeapArrayDisposer::disposeImpl
                      ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,8,
                       -lVar7 >> 3,capacity,(_func_void_void_ptr *)0x0);
            return extraout_RAX_00;
          }
          uVar3 = 1;
          if (opReader._reader.dataSize < 0x20) {
            puVar6 = (undefined1 *)0x0;
          }
          else {
            puVar6 = (undefined1 *)(ulong)*(ushort *)((long)opReader._reader.data + 2);
          }
        }
      }
      local_78 = (void *)((long)firstElement + lVar8);
      *(ulong *)((long)firstElement + lVar8 + -8) = ((ulong)puVar6 & 0xffff) << 0x20 | uVar3;
      index = index + 1;
      lVar7 = lVar7 + -8;
      lVar8 = lVar8 + 8;
    } while (LVar2 != index);
    pvVar4 = (void *)((long)firstElement - lVar7);
  }
  pMVar5 = (Maybe<kj::Array<capnp::PipelineOp>_> *)((long)pvVar4 - (long)firstElement >> 3);
  *in_RDI = 1;
  *(void **)(in_RDI + 8) = firstElement;
  *(Maybe<kj::Array<capnp::PipelineOp>_> **)(in_RDI + 0x10) = pMVar5;
  *(undefined8 **)(in_RDI + 0x18) = &kj::_::HeapArrayDisposer::instance;
  return pMVar5;
}

Assistant:

kj::Maybe<kj::Array<PipelineOp>> toPipelineOps(List<rpc::PromisedAnswer::Op>::Reader ops) {
  auto result = kj::heapArrayBuilder<PipelineOp>(ops.size());
  for (auto opReader: ops) {
    PipelineOp op;
    switch (opReader.which()) {
      case rpc::PromisedAnswer::Op::NOOP:
        op.type = PipelineOp::NOOP;
        break;
      case rpc::PromisedAnswer::Op::GET_POINTER_FIELD:
        op.type = PipelineOp::GET_POINTER_FIELD;
        op.pointerIndex = opReader.getGetPointerField();
        break;
      default:
        KJ_FAIL_REQUIRE("Unsupported pipeline op.", (uint)opReader.which()) {
          return nullptr;
        }
    }
    result.add(op);
  }
  return result.finish();
}